

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O3

bool __thiscall
QMimeDatabasePrivate::inherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  undefined1 *puVar1;
  bool bVar2;
  reference pQVar3;
  QString *nameOrAlias;
  long lVar4;
  long in_FS_OFFSET;
  QStringView rhs;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar5;
  QStringView lhs;
  QDuplicateTracker<QString,_32UL> seen;
  QString local_768;
  QArrayDataPointer<QString> local_748;
  QString local_728;
  QArrayDataPointer<QString> local_708;
  QString local_6e8;
  _Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
  *local_6c8;
  undefined1 local_6c0 [1600];
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_6e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_6e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  resolveAlias(&local_6e8,this,parent);
  memcpy((QDuplicateTracker<QString,_32UL> *)local_6c0,&DAT_005a4c48,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker((QDuplicateTracker<QString,_32UL> *)local_6c0)
  ;
  local_708.d = (Data *)0x0;
  local_708.ptr = (QString *)0x0;
  local_708.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_708,0,mime);
  QList<QString>::end((QList<QString> *)&local_708);
  if (local_708.size != 0) {
    do {
      pQVar3 = std::stack<QString,_QList<QString>_>::top
                         ((stack<QString,_QList<QString>_> *)&local_708);
      puVar1 = (undefined1 *)(pQVar3->d).size;
      if (puVar1 == (undefined1 *)local_6e8.d.size) {
        rhs.m_data = local_6e8.d.ptr;
        rhs.m_size = (qsizetype)puVar1;
        lhs.m_data = (pQVar3->d).ptr;
        lhs.m_size = (qsizetype)puVar1;
        bVar2 = QtPrivate::equalStrings(lhs,rhs);
        if (bVar2) {
          bVar2 = true;
          goto LAB_004a1c30;
        }
      }
      local_728.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_728.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_728.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = std::stack<QString,_QList<QString>_>::top
                         ((stack<QString,_QList<QString>_> *)&local_708);
      local_728.d.d = (pQVar3->d).d;
      local_728.d.ptr = (pQVar3->d).ptr;
      local_728.d.size = (pQVar3->d).size;
      if (&(local_728.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_728.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_728.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      std::stack<QString,_QList<QString>_>::pop((stack<QString,_QList<QString>_> *)&local_708);
      local_748.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_748.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_748.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      parents((QStringList *)&local_748,this,&local_728);
      if ((undefined1 *)local_748.size != (undefined1 *)0x0) {
        lVar4 = local_748.size * 0x18;
        nameOrAlias = local_748.ptr;
        do {
          local_768.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_768.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_768.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          resolveAlias(&local_768,this,nameOrAlias);
          local_6c8 = (_Hashtable_alloc<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
                       *)(local_6c0 + 0x648);
          pVar5 = std::
                  _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                            ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)(local_6c0 + 0x640),&local_768,&local_6c8);
          if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_708,local_708.size,&local_768);
            QList<QString>::end((QList<QString> *)&local_708);
          }
          if (&(local_768.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_768.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_768.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_768.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_768.d.d)->super_QArrayData,2,0x10);
            }
          }
          nameOrAlias = nameOrAlias + 1;
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != 0);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_748);
      if (&(local_728.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_728.d.d)->super_QArrayData,2,0x10);
        }
      }
    } while (local_708.size != 0);
  }
  bVar2 = false;
LAB_004a1c30:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_708);
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_6c0 + 0x640));
  std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource
            ((monotonic_buffer_resource *)(local_6c0 + 0x600));
  if (&(local_6e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_6e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_6e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_6e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_6e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeDatabasePrivate::inherits(const QString &mime, const QString &parent)
{
    const QString resolvedParent = resolveAlias(parent);
    QDuplicateTracker<QString> seen;
    std::stack<QString, QStringList> toCheck;
    toCheck.push(mime);
    while (!toCheck.empty()) {
        if (toCheck.top() == resolvedParent)
            return true;
        const QString mimeName = toCheck.top();
        toCheck.pop();
        const auto parentList = parents(mimeName);
        for (const QString &par : parentList) {
            const QString resolvedPar = resolveAlias(par);
            if (!seen.hasSeen(resolvedPar))
                toCheck.push(resolvedPar);
        }
    }
    return false;
}